

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
* __thiscall
PDA::getStateCombinations
          (vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
           *__return_storage_ptr__,PDA *this,int size)

{
  pointer ppSVar1;
  State *pSVar2;
  pointer pvVar3;
  pointer ppSVar4;
  pointer __x;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  *pvVar5;
  initializer_list<State_*> __l;
  initializer_list<State_*> __l_00;
  allocator_type local_d1;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  *local_d0;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  local_c8;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  smallerCombinations;
  State *local_80;
  vector<State_*,_std::allocator<State_*>_> combination;
  _Vector_base<State_*,_std::allocator<State_*>_> local_60;
  _Vector_base<State_*,_std::allocator<State_*>_> local_48;
  
  local_c8.
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (size == 1) {
    ppSVar1 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_d0 = __return_storage_ptr__;
    for (ppSVar4 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppSVar4 != ppSVar1; ppSVar4 = ppSVar4 + 1) {
      combination.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*ppSVar4;
      __l._M_len = 1;
      __l._M_array = (iterator)&combination;
      std::vector<State_*,_std::allocator<State_*>_>::vector
                ((vector<State_*,_std::allocator<State_*>_> *)&smallerCombinations,__l,
                 (allocator_type *)&local_60);
      std::
      vector<std::vector<State*,std::allocator<State*>>,std::allocator<std::vector<State*,std::allocator<State*>>>>
      ::emplace_back<std::vector<State*,std::allocator<State*>>>
                ((vector<std::vector<State*,std::allocator<State*>>,std::allocator<std::vector<State*,std::allocator<State*>>>>
                  *)&local_c8,(vector<State_*,_std::allocator<State_*>_> *)&smallerCombinations);
      std::_Vector_base<State_*,_std::allocator<State_*>_>::~_Vector_base
                ((_Vector_base<State_*,_std::allocator<State_*>_> *)&smallerCombinations);
    }
  }
  else {
    pvVar5 = __return_storage_ptr__;
    if (size < 1) goto LAB_0010a575;
    local_d0 = __return_storage_ptr__;
    getStateCombinations(&smallerCombinations,this,size + -1);
    ppSVar1 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppSVar4 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pvVar3 = smallerCombinations.
                 super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, ppSVar4 != ppSVar1;
        ppSVar4 = ppSVar4 + 1) {
      pSVar2 = *ppSVar4;
      for (__x = smallerCombinations.
                 super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != pvVar3; __x = __x + 1) {
        std::vector<State_*,_std::allocator<State_*>_>::vector
                  ((vector<State_*,_std::allocator<State_*>_> *)
                   &combination.super__Vector_base<State_*,_std::allocator<State_*>_>,__x);
        __l_00._M_len = 1;
        __l_00._M_array = &local_80;
        local_80 = pSVar2;
        std::vector<State_*,_std::allocator<State_*>_>::vector
                  ((vector<State_*,_std::allocator<State_*>_> *)&local_48,__l_00,&local_d1);
        vectorUnion((vector<State_*,_std::allocator<State_*>_> *)&local_60,
                    (vector<State_*,_std::allocator<State_*>_> *)&local_48,
                    (vector<State_*,_std::allocator<State_*>_> *)
                    &combination.super__Vector_base<State_*,_std::allocator<State_*>_>);
        std::
        vector<std::vector<State*,std::allocator<State*>>,std::allocator<std::vector<State*,std::allocator<State*>>>>
        ::emplace_back<std::vector<State*,std::allocator<State*>>>
                  ((vector<std::vector<State*,std::allocator<State*>>,std::allocator<std::vector<State*,std::allocator<State*>>>>
                    *)&local_c8,(vector<State_*,_std::allocator<State_*>_> *)&local_60);
        std::_Vector_base<State_*,_std::allocator<State_*>_>::~_Vector_base(&local_60);
        std::_Vector_base<State_*,_std::allocator<State_*>_>::~_Vector_base(&local_48);
        std::_Vector_base<State_*,_std::allocator<State_*>_>::~_Vector_base
                  (&combination.super__Vector_base<State_*,_std::allocator<State_*>_>);
      }
    }
    std::
    vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
    ::~vector(&smallerCombinations);
  }
  __return_storage_ptr__ = &local_c8;
  (local_d0->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_c8.
       super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_d0->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_c8.
       super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_d0->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c8.
       super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar5 = local_d0;
LAB_0010a575:
  (__return_storage_ptr__->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ::~vector(&local_c8);
  return pvVar5;
}

Assistant:

std::vector<std::vector<State *>> PDA::getStateCombinations(int size) {
    std::vector<std::vector<State*>> combinations = {};
    if(size == 1) {
        for(State* state: statesQ){
            combinations.push_back({state});
        }
    } else if (size < 1) {
        return {};
    } else {
        std::vector<std::vector<State*>> smallerCombinations = getStateCombinations(size-1);
        for (State* state: statesQ) {
            for(std::vector<State*> combination: smallerCombinations){
                combinations.push_back(vectorUnion({state}, combination));
            }
        }
    }

    return combinations;
}